

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.cc
# Opt level: O3

void __thiscall re2::RE2::Set::~Set(Set *this)

{
  Prog *this_00;
  pointer ppRVar1;
  ulong uVar2;
  
  ppRVar1 = (this->re_).super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->re_).super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppRVar1) {
    uVar2 = 0;
    do {
      Regexp::Decref(ppRVar1[uVar2]);
      uVar2 = uVar2 + 1;
      ppRVar1 = (this->re_).super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->re_).
                                   super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3))
    ;
  }
  this_00 = this->prog_;
  if (this_00 != (Prog *)0x0) {
    Prog::~Prog(this_00);
  }
  operator_delete(this_00);
  ppRVar1 = (this->re_).super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar1 != (pointer)0x0) {
    operator_delete(ppRVar1);
    return;
  }
  return;
}

Assistant:

RE2::Set::~Set() {
  for (size_t i = 0; i < re_.size(); i++)
    re_[i]->Decref();
  delete prog_;
}